

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcRectangularTrimmedSurface::~IfcRectangularTrimmedSurface
          (IfcRectangularTrimmedSurface *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x955fb0;
  *(undefined8 *)&this->field_0xb8 = 0x956078;
  *(undefined8 *)
   &(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x955fd8;
  *(undefined8 *)
   &(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x956000;
  *(undefined8 *)
   &(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.field_0x30
       = 0x956028;
  *(undefined8 *)&(this->super_IfcBoundedSurface).super_IfcSurface.field_0x40 = 0x956050;
  pcVar2 = (this->Vsense)._M_dataplus._M_p;
  paVar1 = &(this->Vsense).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->Usense)._M_dataplus._M_p;
  paVar1 = &(this->Usense).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0xd0);
  return;
}

Assistant:

IfcRectangularTrimmedSurface() : Object("IfcRectangularTrimmedSurface") {}